

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

ChArchiveIn * __thiscall
chrono::ChArchiveIn::operator>>(ChArchiveIn *this,ChNameValue<myEmployee> *bVal)

{
  ChNameValue<myEmployee> local_30;
  ChNameValue<myEmployee> *local_18;
  ChNameValue<myEmployee> *bVal_local;
  ChArchiveIn *this_local;
  
  local_18 = bVal;
  bVal_local = (ChNameValue<myEmployee> *)this;
  ChNameValue<myEmployee>::ChNameValue(&local_30,bVal);
  in<myEmployee>(this,&local_30);
  ChNameValue<myEmployee>::~ChNameValue(&local_30);
  return this;
}

Assistant:

ChArchiveIn& operator>>(ChNameValue<T> bVal) {
          this->in(bVal);
          return (*this);
      }